

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng.cc
# Opt level: O3

void __thiscall S2LatLng::S2LatLng(S2LatLng *this,S2Point *p)

{
  double dVar1;
  S2LogMessage SStack_38;
  double local_28;
  
  local_28 = atan2(p->c_[2],SQRT(p->c_[1] * p->c_[1] + p->c_[0] * p->c_[0]));
  dVar1 = atan2(p->c_[1],p->c_[0]);
  (this->coords_).c_[0] = local_28;
  (this->coords_).c_[1] = dVar1;
  if ((1.5707963267948966 < ABS(local_28)) || (3.141592653589793 < ABS(dVar1))) {
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng.cc"
               ,0x30,kError,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,"Invalid S2LatLng in constructor: ",0x21);
    ::operator<<(SStack_38.stream_,this);
    S2LogMessage::~S2LogMessage(&SStack_38);
  }
  return;
}

Assistant:

S2LatLng::S2LatLng(const S2Point& p)
  : coords_(Latitude(p).radians(), Longitude(p).radians()) {
  // The latitude and longitude are already normalized.
  S2_DLOG_IF(ERROR, !is_valid())
      << "Invalid S2LatLng in constructor: " << *this;
}